

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superblock.cc
# Opt level: O0

fdb_status sb_bmp_fetch_doc(fdb_kvs_handle *handle)

{
  uint32_t uVar1;
  __pointer_type puVar2;
  uint64_t uVar3;
  size_t sVar4;
  int64_t iVar5;
  atomic<unsigned_char_*> *this;
  void *pvVar6;
  long in_RDI;
  uint64_t sb_bmp_size;
  sb_rsv_bmp *rsv;
  superblock *sb;
  char doc_key [64];
  int64_t r_offset;
  uint64_t num_docs;
  size_t i;
  memory_order in_stack_ffffffffffffff58;
  memory_order in_stack_ffffffffffffff5c;
  atomic<unsigned_char_*> *in_stack_ffffffffffffff60;
  atomic<unsigned_char_*> *in_stack_ffffffffffffff68;
  fdb_status local_84;
  bid_t bVar7;
  uint64_t bmp_size;
  uint8_t *in_stack_ffffffffffffff98;
  avl_tree *in_stack_ffffffffffffffa0;
  ulong local_18;
  
  bmp_size = *(uint64_t *)(*(long *)(in_RDI + 0x48) + 0x198);
  bVar7 = 0;
  puVar2 = std::atomic<unsigned_char_*>::load
                     (in_stack_ffffffffffffff68,
                      (memory_order)((ulong)in_stack_ffffffffffffff60 >> 0x20));
  if ((puVar2 == (__pointer_type)0x0) &&
     (uVar3 = atomic_get_uint64_t((atomic<unsigned_long> *)in_stack_ffffffffffffff60,
                                  in_stack_ffffffffffffff5c), uVar3 != 0)) {
    pthread_spin_lock((pthread_spinlock_t *)(bmp_size + 0xc0));
    puVar2 = std::atomic<unsigned_char_*>::load
                       (in_stack_ffffffffffffff68,
                        (memory_order)((ulong)in_stack_ffffffffffffff60 >> 0x20));
    if (puVar2 == (__pointer_type)0x0) {
      uVar3 = atomic_get_uint64_t((atomic<unsigned_long> *)in_stack_ffffffffffffff60,
                                  in_stack_ffffffffffffff5c);
      sVar4 = _bmp_size_to_num_docs(uVar3);
      *(size_t *)(bmp_size + 0x70) = sVar4;
      if (sVar4 == 0) {
        pthread_spin_unlock((pthread_spinlock_t *)(bmp_size + 0xc0));
      }
      else {
        puVar2 = std::atomic::operator_cast_to_unsigned_char_((atomic<unsigned_char_*> *)0x184ad7);
        free(puVar2);
        calloc(1,uVar3 + 7 >> 3);
        std::atomic<unsigned_char_*>::operator=
                  (in_stack_ffffffffffffff60,
                   (__pointer_type)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        for (local_18 = 0; local_18 < sVar4; local_18 = local_18 + 1) {
          memset((void *)(*(long *)(bmp_size + 0x68) + local_18 * 0x38),0,0x38);
          *(undefined1 **)(*(long *)(bmp_size + 0x68) + local_18 * 0x38 + 0x18) =
               &stack0xffffffffffffff98;
          puVar2 = std::atomic::operator_cast_to_unsigned_char_((atomic<unsigned_char_*> *)0x184b76)
          ;
          *(__pointer_type *)(*(long *)(bmp_size + 0x68) + local_18 * 0x38 + 0x30) =
               puVar2 + local_18 * 0x100000;
          iVar5 = docio_read_doc((docio_handle *)doc_key._56_8_,doc_key._48_8_,
                                 (docio_object *)doc_key._40_8_,(bool)doc_key[0x27]);
          if (iVar5 < 1) {
            puVar2 = std::atomic::operator_cast_to_unsigned_char_
                               ((atomic<unsigned_char_*> *)0x184c02);
            free(puVar2);
            std::atomic<unsigned_char_*>::operator=
                      (in_stack_ffffffffffffff60,
                       (__pointer_type)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)
                      );
            pthread_spin_unlock((pthread_spinlock_t *)(bmp_size + 0xc0));
            if (iVar5 < 0) {
              local_84 = (fdb_status)iVar5;
            }
            else {
              local_84 = FDB_RESULT_SB_READ_FAIL;
            }
            return local_84;
          }
        }
        this = (atomic<unsigned_char_*> *)(bmp_size + 0x50);
        std::atomic::operator_cast_to_unsigned_char_((atomic<unsigned_char_*> *)0x184c98);
        atomic_get_uint64_t((atomic<unsigned_long> *)this,in_stack_ffffffffffffff5c);
        _construct_bmp_idx(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,bmp_size,bVar7);
        bVar7 = *(bid_t *)(bmp_size + 0x88);
        if ((bVar7 != 0) &&
           (uVar1 = atomic_get_uint32_t((atomic<unsigned_int> *)this,in_stack_ffffffffffffff5c),
           uVar1 == 1)) {
          sVar4 = _bmp_size_to_num_docs(*(uint64_t *)(bVar7 + 8));
          *(size_t *)(bVar7 + 0x38) = sVar4;
          if (sVar4 == 0) {
            pthread_spin_unlock((pthread_spinlock_t *)(bmp_size + 0xc0));
            return FDB_RESULT_SUCCESS;
          }
          pvVar6 = calloc(1,*(long *)(bVar7 + 8) + 7U >> 3);
          *(void **)(bVar7 + 0x10) = pvVar6;
          for (local_18 = 0; local_18 < sVar4; local_18 = local_18 + 1) {
            memset((void *)(*(long *)(bVar7 + 0x30) + local_18 * 0x38),0,0x38);
            *(undefined1 **)(*(long *)(bVar7 + 0x30) + local_18 * 0x38 + 0x18) =
                 &stack0xffffffffffffff98;
            *(ulong *)(*(long *)(bVar7 + 0x30) + local_18 * 0x38 + 0x30) =
                 *(long *)(bVar7 + 0x10) + local_18 * 0x100000;
            iVar5 = docio_read_doc((docio_handle *)doc_key._56_8_,doc_key._48_8_,
                                   (docio_object *)doc_key._40_8_,(bool)doc_key[0x27]);
            if (iVar5 < 1) {
              free(*(void **)(bVar7 + 0x10));
              puVar2 = std::atomic::operator_cast_to_unsigned_char_
                                 ((atomic<unsigned_char_*> *)0x184e87);
              free(puVar2);
              puVar2 = std::atomic<unsigned_char_*>::operator=
                                 (this,(__pointer_type)
                                       CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)
                                 );
              *(__pointer_type *)(bVar7 + 0x10) = puVar2;
              pthread_spin_unlock((pthread_spinlock_t *)(bmp_size + 0xc0));
              if (-1 < iVar5) {
                return FDB_RESULT_SB_READ_FAIL;
              }
              return (fdb_status)iVar5;
            }
          }
          _construct_bmp_idx(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,bmp_size,bVar7);
          atomic_store_uint32_t
                    ((atomic<unsigned_int> *)this,in_stack_ffffffffffffff5c,
                     in_stack_ffffffffffffff58);
        }
        pthread_spin_unlock((pthread_spinlock_t *)(bmp_size + 0xc0));
      }
    }
    else {
      pthread_spin_unlock((pthread_spinlock_t *)(bmp_size + 0xc0));
    }
  }
  return FDB_RESULT_SUCCESS;
}

Assistant:

fdb_status sb_bmp_fetch_doc(fdb_kvs_handle *handle)
{
    // == read bitmap from system docs ==
    size_t i;
    uint64_t num_docs;
    int64_t r_offset;
    char doc_key[64];
    struct superblock *sb = handle->file->sb;
    struct sb_rsv_bmp *rsv = NULL;

    // skip if previous bitmap exists OR
    // there is no bitmap to be fetched (fast screening)
    if (sb->bmp.load(std::memory_order_relaxed) ||
        atomic_get_uint64_t(&sb->bmp_size) == 0) {
        return FDB_RESULT_SUCCESS;
    }

    spin_lock(&sb->lock);

    // check once again if superblock is already initialized
    // while the thread was blocked by the lock.
    if (sb->bmp.load(std::memory_order_relaxed)) {
        spin_unlock(&sb->lock);
        return FDB_RESULT_SUCCESS;
    }

    uint64_t sb_bmp_size = atomic_get_uint64_t(&sb->bmp_size);
    sb->num_bmp_docs = num_docs = _bmp_size_to_num_docs(sb_bmp_size);
    if (!num_docs) {
        spin_unlock(&sb->lock);
        return FDB_RESULT_SUCCESS;
    }

    free(sb->bmp);
    sb->bmp = (uint8_t*)calloc(1, (sb_bmp_size+7) / 8);

    for (i=0; i<num_docs; ++i) {
        memset(&sb->bmp_docs[i], 0x0, sizeof(struct docio_object));
        // pre-allocated buffer for key
        sb->bmp_docs[i].key = (void*)doc_key;
        // directly point to the bitmap
        sb->bmp_docs[i].body = sb->bmp + (i * SB_MAX_BITMAP_DOC_SIZE);

        r_offset = docio_read_doc(handle->dhandle, sb->bmp_doc_offset[i],
                                  &sb->bmp_docs[i], true);
        if (r_offset <= 0) {
            // read fail
            free(sb->bmp);
            sb->bmp = NULL;

            spin_unlock(&sb->lock);
            return r_offset < 0 ? (fdb_status) r_offset : FDB_RESULT_SB_READ_FAIL;
        }
    }

    _construct_bmp_idx(&sb->bmp_idx, sb->bmp, sb_bmp_size,
                       atomic_get_uint64_t(&sb->cur_alloc_bid));

    rsv = sb->rsv_bmp;
    if (rsv && atomic_get_uint32_t(&rsv->status) == SB_RSV_INITIALIZING) {
        // reserved bitmap exists
        rsv->num_bmp_docs = num_docs = _bmp_size_to_num_docs(rsv->bmp_size);
        if (!num_docs) {
            spin_unlock(&sb->lock);
            return FDB_RESULT_SUCCESS;
        }

        rsv->bmp = (uint8_t*)calloc(1, (rsv->bmp_size+7) / 8);

        for (i=0; i<num_docs; ++i) {

            memset(&rsv->bmp_docs[i], 0x0, sizeof(struct docio_object));
            // pre-allocated buffer for key
            rsv->bmp_docs[i].key = (void*)doc_key;
            // directly point to the (reserved) bitmap
            rsv->bmp_docs[i].body = rsv->bmp + (i * SB_MAX_BITMAP_DOC_SIZE);

            r_offset = docio_read_doc(handle->dhandle, rsv->bmp_doc_offset[i],
                                      &rsv->bmp_docs[i], true);
            if (r_offset <= 0) {
                // read fail
                free(rsv->bmp);
                free(sb->bmp);
                rsv->bmp = sb->bmp = NULL;

                spin_unlock(&sb->lock);
                return r_offset < 0 ? (fdb_status) r_offset : FDB_RESULT_SB_READ_FAIL;
            }
        }

        _construct_bmp_idx(&rsv->bmp_idx, rsv->bmp, rsv->bmp_size, 0);
        atomic_store_uint32_t(&rsv->status, SB_RSV_READY);
    }

    spin_unlock(&sb->lock);
    return FDB_RESULT_SUCCESS;
}